

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode Curl_parse_port(Curl_URL *u,dynbuf *host,_Bool has_scheme)

{
  int iVar1;
  char *pcVar2;
  size_t keep;
  size_t sStack_58;
  char portbuf [7];
  long port;
  char *rest;
  char *pcStack_40;
  int zonelen;
  char *hostname;
  int len;
  char endbracket;
  char *portptr;
  dynbuf *pdStack_20;
  _Bool has_scheme_local;
  dynbuf *host_local;
  Curl_URL *u_local;
  
  _len = (char *)0x0;
  portptr._7_1_ = has_scheme;
  pdStack_20 = host;
  host_local = (dynbuf *)u;
  pcStack_40 = Curl_dyn_ptr(host);
  iVar1 = __isoc99_sscanf(pcStack_40,"[%*45[0123456789abcdefABCDEF:.]%c%n",(long)&hostname + 7,
                          &hostname);
  if (iVar1 == 1) {
    if (hostname._7_1_ == ']') {
      _len = pcStack_40 + (int)hostname;
    }
    else {
      if (hostname._7_1_ != '%') {
        return CURLUE_BAD_IPV6;
      }
      rest._4_4_ = (int)hostname;
      iVar1 = __isoc99_sscanf(pcStack_40 + (int)hostname,"%*[^]]%c%n",(long)&hostname + 7,&hostname)
      ;
      if (iVar1 != 1) {
        return CURLUE_BAD_IPV6;
      }
      if (hostname._7_1_ != ']') {
        return CURLUE_BAD_IPV6;
      }
      rest._4_4_ = rest._4_4_ + -1;
      _len = pcStack_40 + (rest._4_4_ + (int)hostname + 1);
    }
    if ((_len == (char *)0x0) || (*_len == '\0')) {
      _len = (char *)0x0;
    }
    else if (*_len != ':') {
      return CURLUE_BAD_IPV6;
    }
  }
  else {
    _len = strchr(pcStack_40,0x3a);
  }
  if (_len != (char *)0x0) {
    Curl_dyn_setlen(pdStack_20,(long)_len - (long)pcStack_40);
    _len = _len + 1;
    if (*_len == '\0') {
      if ((portptr._7_1_ & 1) == 0) {
        return CURLUE_BAD_PORT_NUMBER;
      }
      return CURLUE_OK;
    }
    if ((*_len < '0') || ('9' < *_len)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    sStack_58 = strtol(_len,(char **)&port,10);
    if (0xffff < (long)sStack_58) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*(char *)port != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    *(undefined1 *)port = 0;
    curl_msnprintf((char *)((long)&keep + 1),7,"%ld",sStack_58);
    host_local[2].allc = sStack_58;
    pcVar2 = (*Curl_cstrdup)((char *)((long)&keep + 1));
    host_local[1].allc = (size_t)pcVar2;
    if (host_local[1].allc == 0) {
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  return CURLUE_OK;
}

Assistant:

UNITTEST CURLUcode Curl_parse_port(struct Curl_URL *u, struct dynbuf *host,
                                   bool has_scheme)
{
  char *portptr = NULL;
  char endbracket;
  int len;
  char *hostname = Curl_dyn_ptr(host);
  /*
   * Find the end of an IPv6 address, either on the ']' ending bracket or
   * a percent-encoded zone index.
   */
  if(1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.]%c%n",
                 &endbracket, &len)) {
    if(']' == endbracket)
      portptr = &hostname[len];
    else if('%' == endbracket) {
      int zonelen = len;
      if(1 == sscanf(hostname + zonelen, "%*[^]]%c%n", &endbracket, &len)) {
        if(']' != endbracket)
          return CURLUE_BAD_IPV6;
        portptr = &hostname[--zonelen + len + 1];
      }
      else
        return CURLUE_BAD_IPV6;
    }
    else
      return CURLUE_BAD_IPV6;

    /* this is a RFC2732-style specified IP-address */
    if(portptr && *portptr) {
      if(*portptr != ':')
        return CURLUE_BAD_IPV6;
    }
    else
      portptr = NULL;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];
    size_t keep = portptr - hostname;

    /* Browser behavior adaptation. If there's a colon with no digits after,
       just cut off the name there which makes us ignore the colon and just
       use the default port. Firefox, Chrome and Safari all do that.

       Don't do it if the URL has no scheme, to make something that looks like
       a scheme not work!
    */
    Curl_dyn_setlen(host, keep);
    portptr++;
    if(!*portptr)
      return has_scheme ? CURLUE_OK : CURLUE_BAD_PORT_NUMBER;

    if(!ISDIGIT(*portptr))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr, &rest, 10);  /* Port number must be decimal */

    if(port > 0xffff)
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    *rest = 0;
    /* generate a new port number string to get rid of leading zeroes etc */
    msnprintf(portbuf, sizeof(portbuf), "%ld", port);
    u->portnum = port;
    u->port = strdup(portbuf);
    if(!u->port)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}